

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::RunProcess_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  ostream *poVar5;
  ostream *poVar6;
  int length;
  char *data;
  double timeout;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&data);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_Execute(cp);
  data = (char *)0x0;
  timeout = 255.0;
  while (uVar1 = cmsysProcess_WaitForData(cp,&data,&length,&timeout), (uVar1 & 0xfffffffe) == 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)data);
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar2 = cmsysProcess_GetState(cp);
  iVar3 = 0;
  switch(iVar2) {
  case 0:
  case 3:
  case 5:
  case 6:
    poVar6 = std::operator<<((ostream *)&std::cerr,"Unexpected ending state after running ");
    poVar6 = std::operator<<(poVar6,*(args->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar3 = 0;
    break;
  case 1:
    poVar6 = (ostream *)&std::cerr;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: Could not run ");
    poVar5 = std::operator<<(poVar5,*(args->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar5,":\n");
    pcVar4 = cmsysProcess_GetErrorString(cp);
    goto LAB_003c961f;
  case 2:
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar6 = std::operator<<(poVar6,*(args->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::operator<<(poVar6," terminated with an exception: ");
    pcVar4 = cmsysProcess_GetExceptionString(cp);
LAB_003c961f:
    poVar6 = std::operator<<(poVar6,pcVar4);
    std::operator<<(poVar6,"\n");
    iVar3 = 0;
    break;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
  }
  cmsysProcess_Delete(cp);
  if (iVar3 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error ");
    poVar6 = std::operator<<(poVar6,*(args->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::operator<<(poVar6," returned :");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    std::operator<<(poVar6,"\n");
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformationImplementation::RunProcess(kwsys_stl::vector<const char*> args)
{
  kwsys_stl::string buffer = "";

  // Run the application
  kwsysProcess* gp = kwsysProcess_New();
  kwsysProcess_SetCommand(gp, &*args.begin());
  kwsysProcess_SetOption(gp,kwsysProcess_Option_HideWindow,1);

  kwsysProcess_Execute(gp);

  char* data = NULL;
  int length;
  double timeout = 255;
  int pipe; // pipe id as returned by kwsysProcess_WaitForData()

  while( ( pipe = kwsysProcess_WaitForData(gp,&data,&length,&timeout),
           (pipe == kwsysProcess_Pipe_STDOUT || pipe == kwsysProcess_Pipe_STDERR) ) ) // wait for 1s
    {
      buffer.append(data, length);
    }
  kwsysProcess_WaitForExit(gp, 0);

  int result = 0;
  switch(kwsysProcess_GetState(gp))
    {
    case kwsysProcess_State_Exited:
      {
      result = kwsysProcess_GetExitValue(gp);
      } break;
    case kwsysProcess_State_Error:
      {
      kwsys_ios::cerr << "Error: Could not run " << args[0] << ":\n";
      kwsys_ios::cerr << kwsysProcess_GetErrorString(gp) << "\n";
      } break;
    case kwsysProcess_State_Exception:
      {
      kwsys_ios::cerr << "Error: " << args[0]
                << " terminated with an exception: "
                << kwsysProcess_GetExceptionString(gp) << "\n";
      } break;
    case kwsysProcess_State_Starting:
    case kwsysProcess_State_Executing:
    case kwsysProcess_State_Expired:
    case kwsysProcess_State_Killed:
      {
      // Should not get here.
      kwsys_ios::cerr << "Unexpected ending state after running " << args[0]
                << kwsys_ios::endl;
      } break;
    }
  kwsysProcess_Delete(gp);
  if(result)
    {
    kwsys_ios::cerr << "Error " << args[0] << " returned :" << result << "\n";
    }
  return buffer;
}